

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O3

TestStatus * __thiscall
vkt::shaderexecutor::
BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_4,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_4,_3>,_tcu::Matrix<float,_4,_3>_>_>
::iterate(TestStatus *__return_storage_ptr__,
         BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_4,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_4,_3>,_tcu::Matrix<float,_4,_3>_>_>
         *this)

{
  double *pdVar1;
  bool *pbVar2;
  _Base_ptr p_Var3;
  ostringstream *poVar4;
  _Rb_tree_node_base *p_Var5;
  Precision PVar6;
  Samplings<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_4,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  *this_00;
  size_t sVar7;
  Statement *pSVar8;
  ShaderExecutor *pSVar9;
  Variable<tcu::Matrix<float,_4,_3>_> *pVVar10;
  pointer pcVar11;
  double dVar12;
  pointer pMVar13;
  bool bVar14;
  bool bVar15;
  int iVar16;
  uint uVar17;
  undefined8 uVar18;
  Interval *pIVar19;
  IVal *pIVar20;
  undefined8 *puVar21;
  float *ival;
  undefined1 *puVar22;
  Matrix<float,_4,_3> *val;
  int row;
  long lVar23;
  FloatFormat *pFVar24;
  long lVar25;
  _Base_ptr p_Var26;
  long lVar27;
  string *msg;
  TestStatus *pTVar28;
  IVal in2;
  IVal in3;
  Environment env;
  FloatFormat highpFmt;
  Outputs<vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_4,_3>,_tcu::Matrix<float,_4,_3>_>_>
  outputs;
  IVal in0;
  void *outputArr [2];
  Inputs<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_4,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  inputs;
  void *inputArr [4];
  IVal in1;
  ResultCollector status;
  ostringstream oss;
  FuncSet funcs;
  deUint32 in_stack_fffffffffffff8b8;
  BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_4,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_4,_3>,_tcu::Matrix<float,_4,_3>_>_>
  *pBVar29;
  BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_4,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_4,_3>,_tcu::Matrix<float,_4,_3>_>_>
  *pBVar30;
  string local_740;
  TestLog *local_720;
  size_t local_718;
  string local_710;
  ulong local_6f0;
  FloatFormat *local_6e8;
  TestStatus *local_6e0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  local_6d8;
  FloatFormat local_6a8;
  long local_680;
  Outputs<vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_4,_3>,_tcu::Matrix<float,_4,_3>_>_>
  local_678;
  undefined1 local_648 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_638;
  double local_628;
  Precision local_620;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  *local_618;
  undefined4 local_610;
  ios_base local_5d8 [8];
  ios_base local_5d0 [264];
  pointer local_4c8;
  pointer local_4c0;
  Inputs<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_4,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  local_4b8;
  pointer local_458;
  pointer local_450;
  pointer local_448;
  pointer local_440;
  undefined1 local_438 [16];
  undefined1 local_428 [280];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_310;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_300;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2d8;
  undefined1 local_2c8 [376];
  undefined1 local_150 [12];
  YesNoMaybe YStack_144;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_140;
  _Rb_tree_node_base *local_130;
  double local_128;
  
  this_00 = this->m_samplings;
  pFVar24 = &(this->m_caseCtx).floatFormat;
  PVar6 = (this->m_caseCtx).precision;
  sVar7 = (this->m_caseCtx).numRandoms;
  local_6e0 = __return_storage_ptr__;
  iVar16 = tcu::CommandLine::getBaseSeed(((this->m_caseCtx).testContext)->m_cmdLine);
  local_6e8 = pFVar24;
  generateInputs<vkt::shaderexecutor::InTypes<tcu::Matrix<float,4,3>,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void>>
            (&local_4b8,(shaderexecutor *)this_00,
             (Samplings<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_4,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
              *)pFVar24,(FloatFormat *)(ulong)PVar6,(Precision)sVar7,(ulong)(iVar16 + 0xdeadbeef),
             in_stack_fffffffffffff8b8);
  pMVar13 = local_4b8.in0.
            super__Vector_base<tcu::Matrix<float,_4,_3>,_std::allocator<tcu::Matrix<float,_4,_3>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_718 = ((long)local_4b8.in0.
                     super__Vector_base<tcu::Matrix<float,_4,_3>,_std::allocator<tcu::Matrix<float,_4,_3>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_4b8.in0.
                     super__Vector_base<tcu::Matrix<float,_4,_3>,_std::allocator<tcu::Matrix<float,_4,_3>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555;
  Outputs<vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_4,_3>,_tcu::Matrix<float,_4,_3>_>_>::
  Outputs(&local_678,local_718);
  local_6a8.m_maxValue = (this->m_caseCtx).highpFormat.m_maxValue;
  local_6a8.m_minExp = (this->m_caseCtx).highpFormat.m_minExp;
  local_6a8.m_maxExp = (this->m_caseCtx).highpFormat.m_maxExp;
  local_6a8.m_fractionBits = (this->m_caseCtx).highpFormat.m_fractionBits;
  local_6a8.m_hasSubnormal = (this->m_caseCtx).highpFormat.m_hasSubnormal;
  local_6a8.m_hasInf = (this->m_caseCtx).highpFormat.m_hasInf;
  local_6a8.m_hasNaN = (this->m_caseCtx).highpFormat.m_hasNaN;
  local_6a8.m_exactPrecision = (this->m_caseCtx).highpFormat.m_exactPrecision;
  local_6a8._25_7_ = *(undefined7 *)&(this->m_caseCtx).highpFormat.field_0x19;
  local_6d8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_6d8._M_impl.super__Rb_tree_header._M_header;
  local_6d8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_6d8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_6d8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_6d8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_6d8._M_impl.super__Rb_tree_header._M_header._M_left;
  tcu::ResultCollector::ResultCollector((ResultCollector *)(local_428 + 0x110));
  local_720 = ((this->super_TestInstance).m_context)->m_testCtx->m_log;
  local_458 = local_4b8.in0.
              super__Vector_base<tcu::Matrix<float,_4,_3>,_std::allocator<tcu::Matrix<float,_4,_3>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_450 = local_4b8.in1.
              super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_448 = local_4b8.in2.
              super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_440 = local_4b8.in3.
              super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_4c8 = local_678.out0.
              super__Vector_base<tcu::Matrix<float,_4,_3>,_std::allocator<tcu::Matrix<float,_4,_3>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_4c0 = local_678.out1.
              super__Vector_base<tcu::Matrix<float,_4,_3>,_std::allocator<tcu::Matrix<float,_4,_3>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  poVar4 = (ostringstream *)(local_648 + 8);
  local_648._0_8_ = local_720;
  std::__cxx11::ostringstream::ostringstream(poVar4);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4,"Statement: ",0xb);
  std::ostream::_M_insert<bool>(SUB81(poVar4,0));
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_648,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar4);
  std::ios_base::~ios_base(local_5d0);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2c8);
  p_Var5 = (_Rb_tree_node_base *)(local_150 + 8);
  local_150._8_4_ = _S_red;
  local_140._M_allocated_capacity = 0;
  local_128 = 0.0;
  pSVar8 = (this->m_stmt).super_SharedPtr<const_vkt::shaderexecutor::Statement>.m_ptr;
  local_140._8_8_ = p_Var5;
  local_130 = p_Var5;
  (*pSVar8->_vptr_Statement[4])(pSVar8,local_150);
  if ((_Rb_tree_node_base *)local_140._8_8_ != p_Var5) {
    uVar18 = local_140._8_8_;
    do {
      (**(code **)(**(long **)(uVar18 + 0x20) + 0x30))(*(long **)(uVar18 + 0x20),local_2c8);
      uVar18 = std::_Rb_tree_increment((_Rb_tree_node_base *)uVar18);
    } while ((_Rb_tree_node_base *)uVar18 != p_Var5);
  }
  pFVar24 = local_6e8;
  if (local_128 != 0.0) {
    poVar4 = (ostringstream *)(local_648 + 8);
    local_648._0_8_ = local_720;
    std::__cxx11::ostringstream::ostringstream(poVar4);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar4,"Reference definitions:\n",0x17);
    std::__cxx11::stringbuf::str();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar4,(char *)local_438._0_8_,local_438._8_8_);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_648,(EndMessageToken *)&tcu::TestLog::EndMessage);
    if ((undefined1 *)local_438._0_8_ != local_428) {
      operator_delete((void *)local_438._0_8_,local_428._0_8_ + 1);
    }
    std::__cxx11::ostringstream::~ostringstream(poVar4);
    std::ios_base::~ios_base(local_5d0);
  }
  std::
  _Rb_tree<const_vkt::shaderexecutor::FuncBase_*,_const_vkt::shaderexecutor::FuncBase_*,_std::_Identity<const_vkt::shaderexecutor::FuncBase_*>,_std::less<const_vkt::shaderexecutor::FuncBase_*>,_std::allocator<const_vkt::shaderexecutor::FuncBase_*>_>
  ::~_Rb_tree((_Rb_tree<const_vkt::shaderexecutor::FuncBase_*,_const_vkt::shaderexecutor::FuncBase_*,_std::_Identity<const_vkt::shaderexecutor::FuncBase_*>,_std::less<const_vkt::shaderexecutor::FuncBase_*>,_std::allocator<const_vkt::shaderexecutor::FuncBase_*>_>
               *)local_150);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2c8);
  std::ios_base::~ios_base((ios_base *)(local_2c8 + 0x70));
  pSVar9 = (this->m_executor).
           super_UniqueBase<vkt::shaderexecutor::ShaderExecutor,_de::DefaultDeleter<vkt::shaderexecutor::ShaderExecutor>_>
           .m_data.ptr;
  ival = (float *)&local_4c8;
  (*pSVar9->_vptr_ShaderExecutor[2])(pSVar9,local_718,&local_458,ival,0);
  tcu::Matrix<tcu::Interval,_4,_3>::Matrix((Matrix<tcu::Interval,_4,_3> *)local_648);
  tcu::Matrix<tcu::Interval,_4,_3>::Matrix((Matrix<tcu::Interval,_4,_3> *)local_2c8);
  tcu::Matrix<tcu::Interval,_4,_3>::Matrix((Matrix<tcu::Interval,_4,_3> *)local_150);
  pBVar29 = this;
  Environment::bind<tcu::Matrix<float,4,3>>
            ((Environment *)&local_6d8,
             (this->m_variables).in0.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_4,_3>_>_>.m_ptr,
             (IVal *)local_648);
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&local_6d8,
             (this->m_variables).in1.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr,
             (IVal *)local_438);
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&local_6d8,
             (this->m_variables).in2.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr,
             (IVal *)&local_740);
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&local_6d8,
             (this->m_variables).in3.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr,
             (IVal *)&local_710);
  Environment::bind<tcu::Matrix<float,4,3>>
            ((Environment *)&local_6d8,
             (this->m_variables).out0.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_4,_3>_>_>.m_ptr,
             (IVal *)local_2c8);
  Environment::bind<tcu::Matrix<float,4,3>>
            ((Environment *)&local_6d8,
             (this->m_variables).out1.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_4,_3>_>_>.m_ptr,
             (IVal *)local_150);
  if (local_4b8.in0.
      super__Vector_base<tcu::Matrix<float,_4,_3>,_std::allocator<tcu::Matrix<float,_4,_3>_>_>.
      _M_impl.super__Vector_impl_data._M_finish == pMVar13) {
LAB_00902304:
    poVar4 = (ostringstream *)(local_648 + 8);
    local_648._0_8_ = local_720;
    std::__cxx11::ostringstream::ostringstream(poVar4);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4,"All ",4);
    pTVar28 = local_6e0;
    std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4," inputs passed.",0xf);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_648,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar4);
    std::ios_base::~ios_base(local_5d0);
    local_648._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)(local_648 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_648,"Pass","");
    pTVar28->m_code = QP_TEST_RESULT_PASS;
    (pTVar28->m_description)._M_dataplus._M_p = (pointer)&(pTVar28->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&pTVar28->m_description,local_648._0_8_,
               (char *)(local_648._0_8_ + CONCAT44(local_648._12_4_,local_648._8_4_)));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_648._0_8_ ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(local_648 + 0x10)) goto LAB_009024e9;
    uVar18 = (_Base_ptr)
             CONCAT44(local_638._M_allocated_capacity._4_4_,local_638._M_allocated_capacity._0_4_);
    local_150._0_8_ = local_648._0_8_;
  }
  else {
    poVar4 = (ostringstream *)(local_648 + 8);
    local_680 = local_718 + (local_718 == 0);
    lVar27 = 0;
    local_6f0 = 0;
    do {
      tcu::Matrix<tcu::Interval,_4,_3>::Matrix((Matrix<tcu::Interval,_4,_3> *)local_2c8);
      tcu::Matrix<tcu::Interval,_4,_3>::Matrix((Matrix<tcu::Interval,_4,_3> *)local_150);
      round<tcu::Matrix<float,4,3>>
                ((IVal *)local_438,(shaderexecutor *)pFVar24,
                 (FloatFormat *)
                 (local_4b8.in0.
                  super__Vector_base<tcu::Matrix<float,_4,_3>,_std::allocator<tcu::Matrix<float,_4,_3>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + lVar27),(Matrix<float,_4,_3> *)ival);
      ContainerTraits<tcu::Matrix<float,_4,_3>,_tcu::Matrix<tcu::Interval,_4,_3>_>::doConvert
                ((IVal *)local_648,pFVar24,(IVal *)local_438);
      pIVar19 = (Interval *)
                Environment::lookup<tcu::Matrix<float,4,3>>
                          ((Environment *)&local_6d8,
                           (pBVar29->m_variables).in0.
                           super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_4,_3>_>_>
                           .m_ptr);
      puVar22 = local_648;
      lVar23 = 0;
      do {
        lVar25 = 0;
        do {
          *(undefined8 *)((long)&pIVar19->m_hi + lVar25) = *(undefined8 *)(puVar22 + lVar25 + 0x10);
          dVar12 = *(double *)((long)(puVar22 + lVar25) + 8);
          pbVar2 = &((Vector<tcu::Vector<tcu::Interval,_4>,_3> *)&pIVar19->m_hasNaN)->m_data[0].
                    m_data[0].m_hasNaN + lVar25;
          *(undefined8 *)pbVar2 = *(undefined8 *)(puVar22 + lVar25);
          *(double *)(pbVar2 + 8) = dVar12;
          lVar25 = lVar25 + 0x60;
        } while (lVar25 != 0x120);
        lVar23 = lVar23 + 1;
        pIVar19 = pIVar19 + 1;
        puVar22 = puVar22 + 0x18;
      } while (lVar23 != 4);
      pBVar30 = pBVar29;
      Environment::lookup<vkt::shaderexecutor::Void>
                ((Environment *)&local_6d8,
                 (pBVar29->m_variables).in1.
                 super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.
                 m_ptr);
      Environment::lookup<vkt::shaderexecutor::Void>
                ((Environment *)&local_6d8,
                 (pBVar29->m_variables).in2.
                 super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.
                 m_ptr);
      Environment::lookup<vkt::shaderexecutor::Void>
                ((Environment *)&local_6d8,
                 (pBVar29->m_variables).in3.
                 super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.
                 m_ptr);
      local_620 = (pBVar29->m_caseCtx).precision;
      local_628 = pFVar24->m_maxValue;
      local_648._0_8_ = *(undefined8 *)pFVar24;
      local_648._8_4_ = pFVar24->m_fractionBits;
      local_648._12_4_ = pFVar24->m_hasSubnormal;
      local_638._M_allocated_capacity._0_4_ = pFVar24->m_hasInf;
      local_638._M_allocated_capacity._4_4_ = pFVar24->m_hasNaN;
      local_638._8_1_ = pFVar24->m_exactPrecision;
      local_638._9_3_ = *(undefined3 *)&pFVar24->field_0x19;
      local_638._12_4_ = *(undefined4 *)&pFVar24->field_0x1c;
      local_610 = 0;
      pSVar8 = (pBVar29->m_stmt).super_SharedPtr<const_vkt::shaderexecutor::Statement>.m_ptr;
      pIVar19 = (Interval *)local_648;
      local_618 = &local_6d8;
      (*pSVar8->_vptr_Statement[3])(pSVar8,pIVar19);
      pIVar20 = Environment::lookup<tcu::Matrix<float,4,3>>
                          ((Environment *)&local_6d8,
                           (pBVar29->m_variables).out1.
                           super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_4,_3>_>_>
                           .m_ptr);
      ContainerTraits<tcu::Matrix<float,_4,_3>,_tcu::Matrix<tcu::Interval,_4,_3>_>::doConvert
                ((IVal *)pIVar19,&local_6a8,pIVar20);
      puVar22 = local_150;
      lVar23 = 0;
      do {
        lVar25 = 0;
        do {
          *(undefined8 *)(puVar22 + lVar25 + 0x10) = *(undefined8 *)((long)&pIVar19->m_hi + lVar25);
          pbVar2 = &((Vector<tcu::Vector<tcu::Interval,_4>,_3> *)&pIVar19->m_hasNaN)->m_data[0].
                    m_data[0].m_hasNaN + lVar25;
          dVar12 = *(double *)(pbVar2 + 8);
          *(undefined8 *)(puVar22 + lVar25) = *(undefined8 *)pbVar2;
          *(double *)((long)(puVar22 + lVar25) + 8) = dVar12;
          lVar25 = lVar25 + 0x60;
        } while (lVar25 != 0x120);
        lVar23 = lVar23 + 1;
        puVar22 = puVar22 + 0x18;
        pIVar19 = pIVar19 + 1;
      } while (lVar23 != 4);
      bVar14 = contains<tcu::Matrix<float,4,3>>
                         ((IVal *)local_150,
                          local_678.out1.
                          super__Vector_base<tcu::Matrix<float,_4,_3>,_std::allocator<tcu::Matrix<float,_4,_3>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + lVar27);
      local_648._0_8_ = local_648 + 0x10;
      msg = (string *)local_648;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)msg,"Shader output 1 is outside acceptable range","");
      bVar14 = tcu::ResultCollector::check((ResultCollector *)(local_428 + 0x110),bVar14,msg);
      pBVar29 = pBVar30;
      if ((TestLog *)local_648._0_8_ != (TestLog *)(local_648 + 0x10)) {
        operator_delete((void *)local_648._0_8_,
                        CONCAT44(local_638._M_allocated_capacity._4_4_,
                                 local_638._M_allocated_capacity._0_4_) + 1);
        pBVar29 = pBVar30;
      }
      pIVar20 = Environment::lookup<tcu::Matrix<float,4,3>>
                          ((Environment *)&local_6d8,
                           (pBVar29->m_variables).out0.
                           super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_4,_3>_>_>
                           .m_ptr);
      ContainerTraits<tcu::Matrix<float,_4,_3>,_tcu::Matrix<tcu::Interval,_4,_3>_>::doConvert
                ((IVal *)msg,&local_6a8,pIVar20);
      ival = (float *)local_2c8;
      lVar23 = 0;
      do {
        lVar25 = 0;
        do {
          *(undefined8 *)((long)ival + lVar25 + 0x10) =
               *(undefined8 *)((long)&msg->field_2 + lVar25);
          puVar21 = (undefined8 *)((long)&(msg->_M_dataplus)._M_p + lVar25);
          uVar18 = puVar21[1];
          *(undefined8 *)((long)ival + lVar25) = *puVar21;
          ((undefined8 *)((long)ival + lVar25))[1] = uVar18;
          lVar25 = lVar25 + 0x60;
        } while (lVar25 != 0x120);
        lVar23 = lVar23 + 1;
        ival = ival + 6;
        msg = (string *)((msg->field_2)._M_local_buf + 8);
      } while (lVar23 != 4);
      bVar15 = contains<tcu::Matrix<float,4,3>>
                         ((IVal *)local_2c8,
                          local_678.out0.
                          super__Vector_base<tcu::Matrix<float,_4,_3>,_std::allocator<tcu::Matrix<float,_4,_3>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + lVar27);
      local_648._0_8_ = local_648 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_648,"Shader output 0 is outside acceptable range","");
      bVar15 = tcu::ResultCollector::check
                         ((ResultCollector *)(local_428 + 0x110),bVar15,(string *)local_648);
      if ((TestLog *)local_648._0_8_ != (TestLog *)(local_648 + 0x10)) {
        operator_delete((void *)local_648._0_8_,
                        CONCAT44(local_638._M_allocated_capacity._4_4_,
                                 local_638._M_allocated_capacity._0_4_) + 1);
      }
      pFVar24 = local_6e8;
      if ((!bVar14 || !bVar15) &&
         (uVar17 = (int)local_6f0 + 1, local_6f0 = (ulong)uVar17, (int)uVar17 < 0x65)) {
        local_648._0_8_ = local_720;
        std::__cxx11::ostringstream::ostringstream(poVar4);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4,"Failed",6);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4," sample:\n",9);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4,"\t",1);
        pVVar10 = (pBVar29->m_variables).in0.
                  super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_4,_3>_>_>.
                  m_ptr;
        val = (Matrix<float,_4,_3> *)local_428;
        pcVar11 = (pVVar10->m_name)._M_dataplus._M_p;
        local_438._0_8_ = val;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_438,pcVar11,pcVar11 + (pVVar10->m_name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar4,(char *)local_438._0_8_,local_438._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4," = ",3);
        valueToString<tcu::Matrix<float,4,3>>
                  (&local_740,(shaderexecutor *)&local_6a8,
                   (FloatFormat *)
                   (local_4b8.in0.
                    super__Vector_base<tcu::Matrix<float,_4,_3>,_std::allocator<tcu::Matrix<float,_4,_3>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + lVar27),val);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar4,local_740._M_dataplus._M_p,local_740._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_740._M_dataplus._M_p != &local_740.field_2) {
          operator_delete(local_740._M_dataplus._M_p,local_740.field_2._M_allocated_capacity + 1);
        }
        if ((Matrix<float,_4,_3> *)local_438._0_8_ != (Matrix<float,_4,_3> *)local_428) {
          operator_delete((void *)local_438._0_8_,local_428._0_8_ + 1);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4,"\t",1);
        pVVar10 = (pBVar29->m_variables).out0.
                  super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_4,_3>_>_>.
                  m_ptr;
        pIVar20 = (IVal *)local_428;
        pcVar11 = (pVVar10->m_name)._M_dataplus._M_p;
        local_438._0_8_ = pIVar20;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_438,pcVar11,pcVar11 + (pVVar10->m_name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar4,(char *)local_438._0_8_,local_438._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4," = ",3);
        valueToString<tcu::Matrix<float,4,3>>
                  (&local_740,(shaderexecutor *)&local_6a8,
                   (FloatFormat *)
                   (local_678.out0.
                    super__Vector_base<tcu::Matrix<float,_4,_3>,_std::allocator<tcu::Matrix<float,_4,_3>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + lVar27),
                   (Matrix<float,_4,_3> *)pIVar20);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar4,local_740._M_dataplus._M_p,local_740._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar4,"\tExpected range: ",0x11);
        intervalToString<tcu::Matrix<float,4,3>>
                  (&local_710,(shaderexecutor *)&local_6a8,(FloatFormat *)local_2c8,pIVar20);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar4,local_710._M_dataplus._M_p,local_710._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_710._M_dataplus._M_p != &local_710.field_2) {
          operator_delete(local_710._M_dataplus._M_p,local_710.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_740._M_dataplus._M_p != &local_740.field_2) {
          operator_delete(local_740._M_dataplus._M_p,local_740.field_2._M_allocated_capacity + 1);
        }
        if ((IVal *)local_438._0_8_ != (IVal *)local_428) {
          operator_delete((void *)local_438._0_8_,local_428._0_8_ + 1);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4,"\t",1);
        pVVar10 = (pBVar29->m_variables).out1.
                  super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_4,_3>_>_>.
                  m_ptr;
        ival = (float *)local_428;
        pcVar11 = (pVVar10->m_name)._M_dataplus._M_p;
        local_438._0_8_ = ival;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_438,pcVar11,pcVar11 + (pVVar10->m_name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar4,(char *)local_438._0_8_,local_438._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4," = ",3);
        valueToString<tcu::Matrix<float,4,3>>
                  (&local_740,(shaderexecutor *)&local_6a8,
                   (FloatFormat *)
                   (local_678.out1.
                    super__Vector_base<tcu::Matrix<float,_4,_3>,_std::allocator<tcu::Matrix<float,_4,_3>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + lVar27),(Matrix<float,_4,_3> *)ival)
        ;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar4,local_740._M_dataplus._M_p,local_740._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar4,"\tExpected range: ",0x11);
        intervalToString<tcu::Matrix<float,4,3>>
                  (&local_710,(shaderexecutor *)&local_6a8,(FloatFormat *)local_150,(IVal *)ival);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar4,local_710._M_dataplus._M_p,local_710._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_710._M_dataplus._M_p != &local_710.field_2) {
          operator_delete(local_710._M_dataplus._M_p,local_710.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_740._M_dataplus._M_p != &local_740.field_2) {
          operator_delete(local_740._M_dataplus._M_p,local_740.field_2._M_allocated_capacity + 1);
        }
        if ((undefined1 *)local_438._0_8_ != local_428) {
          operator_delete((void *)local_438._0_8_,local_428._0_8_ + 1);
        }
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_648,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar4);
        std::ios_base::~ios_base(local_5d0);
      }
      lVar27 = lVar27 + 1;
    } while (lVar27 != local_680);
    iVar16 = (int)local_6f0;
    if (iVar16 < 0x65) {
      if (iVar16 == 0) goto LAB_00902304;
    }
    else {
      poVar4 = (ostringstream *)(local_648 + 8);
      local_648._0_8_ = local_720;
      std::__cxx11::ostringstream::ostringstream(poVar4);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4,"(Skipped ",9);
      std::ostream::operator<<(poVar4,iVar16 + -100);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4," messages.)",0xb);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_648,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar4);
      std::ios_base::~ios_base(local_5d0);
    }
    poVar4 = (ostringstream *)(local_648 + 8);
    local_648._0_8_ = local_720;
    std::__cxx11::ostringstream::ostringstream(poVar4);
    std::ostream::operator<<(poVar4,iVar16);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4,"/",1);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4," inputs failed.",0xf);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_648,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar4);
    std::ios_base::~ios_base(local_5d0);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_648);
    std::ostream::operator<<(local_648,iVar16);
    pTVar28 = local_6e0;
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_648);
    std::ios_base::~ios_base(local_5d8);
    local_648._0_8_ = local_648 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_648," test failed. Check log for the details","");
    p_Var3 = (_Base_ptr)
             (CONCAT44(local_648._12_4_,local_648._8_4_) + CONCAT44(YStack_144,local_150._8_4_));
    uVar18 = (_Base_ptr)0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._0_8_ != &local_140) {
      uVar18 = local_140._M_allocated_capacity;
    }
    if ((ulong)uVar18 < p_Var3) {
      p_Var26 = (_Base_ptr)0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_648._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(local_648 + 0x10)) {
        p_Var26 = (_Base_ptr)
                  CONCAT44(local_638._M_allocated_capacity._4_4_,
                           local_638._M_allocated_capacity._0_4_);
      }
      if (p_Var26 < p_Var3) goto LAB_009022f2;
      puVar21 = (undefined8 *)
                std::__cxx11::string::replace((ulong)local_648,0,(char *)0x0,local_150._0_8_);
    }
    else {
LAB_009022f2:
      puVar21 = (undefined8 *)std::__cxx11::string::_M_append(local_150,local_648._0_8_);
    }
    local_2c8._0_8_ = local_2c8 + 0x10;
    pdVar1 = (double *)(puVar21 + 2);
    if ((double *)*puVar21 == pdVar1) {
      local_2c8._16_8_ = *pdVar1;
      local_2c8._24_4_ = *(undefined4 *)(puVar21 + 3);
      local_2c8._28_4_ = *(undefined4 *)((long)puVar21 + 0x1c);
    }
    else {
      local_2c8._16_8_ = *pdVar1;
      local_2c8._0_8_ = (double *)*puVar21;
    }
    local_2c8._8_8_ = puVar21[1];
    *puVar21 = pdVar1;
    puVar21[1] = 0;
    *(undefined1 *)pdVar1 = 0;
    pTVar28->m_code = QP_TEST_RESULT_FAIL;
    (pTVar28->m_description)._M_dataplus._M_p = (pointer)&(pTVar28->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&pTVar28->m_description,local_2c8._0_8_,
               (undefined1 *)(local_2c8._8_8_ + local_2c8._0_8_));
    if ((undefined1 *)local_2c8._0_8_ != local_2c8 + 0x10) {
      operator_delete((void *)local_2c8._0_8_,local_2c8._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_648._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(local_648 + 0x10)) {
      operator_delete((void *)local_648._0_8_,
                      CONCAT44(local_638._M_allocated_capacity._4_4_,
                               local_638._M_allocated_capacity._0_4_) + 1);
    }
    uVar18 = local_140._M_allocated_capacity;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._0_8_ == &local_140) goto LAB_009024e9;
  }
  operator_delete((void *)local_150._0_8_,(ulong)((long)&((_Base_ptr)uVar18)->_M_color + 1));
LAB_009024e9:
  if (local_2e8 != &local_2d8) {
    operator_delete(local_2e8,local_2d8._M_allocated_capacity + 1);
  }
  if (local_310 != &local_300) {
    operator_delete(local_310,local_300._M_allocated_capacity + 1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  ::~_Rb_tree(&local_6d8);
  if (local_678.out1.
      super__Vector_base<tcu::Matrix<float,_4,_3>,_std::allocator<tcu::Matrix<float,_4,_3>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_678.out1.
                    super__Vector_base<tcu::Matrix<float,_4,_3>,_std::allocator<tcu::Matrix<float,_4,_3>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_678.out1.
                          super__Vector_base<tcu::Matrix<float,_4,_3>,_std::allocator<tcu::Matrix<float,_4,_3>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_678.out1.
                          super__Vector_base<tcu::Matrix<float,_4,_3>,_std::allocator<tcu::Matrix<float,_4,_3>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_678.out0.
      super__Vector_base<tcu::Matrix<float,_4,_3>,_std::allocator<tcu::Matrix<float,_4,_3>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_678.out0.
                    super__Vector_base<tcu::Matrix<float,_4,_3>,_std::allocator<tcu::Matrix<float,_4,_3>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_678.out0.
                          super__Vector_base<tcu::Matrix<float,_4,_3>,_std::allocator<tcu::Matrix<float,_4,_3>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_678.out0.
                          super__Vector_base<tcu::Matrix<float,_4,_3>,_std::allocator<tcu::Matrix<float,_4,_3>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_4b8.in3.
      super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_4b8.in3.
                    super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_4b8.in3.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_4b8.in3.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_4b8.in2.
      super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_4b8.in2.
                    super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_4b8.in2.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_4b8.in2.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_4b8.in1.
      super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_4b8.in1.
                    super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_4b8.in1.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_4b8.in1.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_4b8.in0.
      super__Vector_base<tcu::Matrix<float,_4,_3>,_std::allocator<tcu::Matrix<float,_4,_3>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_4b8.in0.
                    super__Vector_base<tcu::Matrix<float,_4,_3>,_std::allocator<tcu::Matrix<float,_4,_3>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_4b8.in0.
                          super__Vector_base<tcu::Matrix<float,_4,_3>,_std::allocator<tcu::Matrix<float,_4,_3>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_4b8.in0.
                          super__Vector_base<tcu::Matrix<float,_4,_3>,_std::allocator<tcu::Matrix<float,_4,_3>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return pTVar28;
}

Assistant:

tcu::TestStatus BuiltinPrecisionCaseTestInstance<In, Out>::iterate (void)
{
	typedef typename	In::In0		In0;
	typedef typename	In::In1		In1;
	typedef typename	In::In2		In2;
	typedef typename	In::In3		In3;
	typedef typename	Out::Out0	Out0;
	typedef typename	Out::Out1	Out1;

	Inputs<In>			inputs		= generateInputs(m_samplings, m_caseCtx.floatFormat, m_caseCtx.precision, m_caseCtx.numRandoms, 0xdeadbeefu + m_caseCtx.testContext.getCommandLine().getBaseSeed());
	const FloatFormat&	fmt			= m_caseCtx.floatFormat;
	const int			inCount		= numInputs<In>();
	const int			outCount	= numOutputs<Out>();
	const size_t		numValues	= (inCount > 0) ? inputs.in0.size() : 1;
	Outputs<Out>		outputs		(numValues);
	const FloatFormat	highpFmt	= m_caseCtx.highpFormat;
	const int			maxMsgs		= 100;
	int					numErrors	= 0;
	Environment			env;		// Hoisted out of the inner loop for optimization.
	ResultCollector		status;
	TestLog&			testLog		= m_context.getTestContext().getLog();

	const void*			inputArr[]	=
	{
		&inputs.in0.front(), &inputs.in1.front(), &inputs.in2.front(), &inputs.in3.front(),
	};
	void*				outputArr[]	=
	{
		&outputs.out0.front(), &outputs.out1.front(),
	};

	// Print out the statement and its definitions
	testLog << TestLog::Message << "Statement: " << m_stmt << TestLog::EndMessage;
	{
		ostringstream	oss;
		FuncSet			funcs;

		m_stmt->getUsedFuncs(funcs);
		for (FuncSet::const_iterator it = funcs.begin(); it != funcs.end(); ++it)
		{
			(*it)->printDefinition(oss);
		}
		if (!funcs.empty())
			testLog << TestLog::Message << "Reference definitions:\n" << oss.str()
				  << TestLog::EndMessage;
	}

	switch (inCount)
	{
		case 4: DE_ASSERT(inputs.in3.size() == numValues);
		case 3: DE_ASSERT(inputs.in2.size() == numValues);
		case 2: DE_ASSERT(inputs.in1.size() == numValues);
		case 1: DE_ASSERT(inputs.in0.size() == numValues);
		default: break;
	}

	m_executor->execute(int(numValues), inputArr, outputArr);

	// Initialize environment with dummy values so we don't need to bind in inner loop.
	{
		const typename Traits<In0>::IVal		in0;
		const typename Traits<In1>::IVal		in1;
		const typename Traits<In2>::IVal		in2;
		const typename Traits<In3>::IVal		in3;
		const typename Traits<Out0>::IVal		reference0;
		const typename Traits<Out1>::IVal		reference1;

		env.bind(*m_variables.in0, in0);
		env.bind(*m_variables.in1, in1);
		env.bind(*m_variables.in2, in2);
		env.bind(*m_variables.in3, in3);
		env.bind(*m_variables.out0, reference0);
		env.bind(*m_variables.out1, reference1);
	}

	// For each input tuple, compute output reference interval and compare
	// shader output to the reference.
	for (size_t valueNdx = 0; valueNdx < numValues; valueNdx++)
	{
		bool						result		= true;
		typename Traits<Out0>::IVal	reference0;
		typename Traits<Out1>::IVal	reference1;

		env.lookup(*m_variables.in0) = convert<In0>(fmt, round(fmt, inputs.in0[valueNdx]));
		env.lookup(*m_variables.in1) = convert<In1>(fmt, round(fmt, inputs.in1[valueNdx]));
		env.lookup(*m_variables.in2) = convert<In2>(fmt, round(fmt, inputs.in2[valueNdx]));
		env.lookup(*m_variables.in3) = convert<In3>(fmt, round(fmt, inputs.in3[valueNdx]));

		{
			EvalContext	ctx (fmt, m_caseCtx.precision, env);
			m_stmt->execute(ctx);
		}

		switch (outCount)
		{
			case 2:
				reference1 = convert<Out1>(highpFmt, env.lookup(*m_variables.out1));
				if (!status.check(contains(reference1, outputs.out1[valueNdx]),
									"Shader output 1 is outside acceptable range"))
					result = false;
			case 1:
				reference0 = convert<Out0>(highpFmt, env.lookup(*m_variables.out0));
				if (!status.check(contains(reference0, outputs.out0[valueNdx]),
									"Shader output 0 is outside acceptable range"))
					result = false;
			default: break;
		}

		if (!result)
			++numErrors;

		if ((!result && numErrors <= maxMsgs) || GLS_LOG_ALL_RESULTS)
		{
			MessageBuilder	builder	= testLog.message();

			builder << (result ? "Passed" : "Failed") << " sample:\n";

			if (inCount > 0)
			{
				builder << "\t" << m_variables.in0->getName() << " = "
						<< valueToString(highpFmt, inputs.in0[valueNdx]) << "\n";
			}

			if (inCount > 1)
			{
				builder << "\t" << m_variables.in1->getName() << " = "
						<< valueToString(highpFmt, inputs.in1[valueNdx]) << "\n";
			}

			if (inCount > 2)
			{
				builder << "\t" << m_variables.in2->getName() << " = "
						<< valueToString(highpFmt, inputs.in2[valueNdx]) << "\n";
			}

			if (inCount > 3)
			{
				builder << "\t" << m_variables.in3->getName() << " = "
						<< valueToString(highpFmt, inputs.in3[valueNdx]) << "\n";
			}

			if (outCount > 0)
			{
				builder << "\t" << m_variables.out0->getName() << " = "
						<< valueToString(highpFmt, outputs.out0[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out0>(highpFmt, reference0) << "\n";
			}

			if (outCount > 1)
			{
				builder << "\t" << m_variables.out1->getName() << " = "
						<< valueToString(highpFmt, outputs.out1[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out1>(highpFmt, reference1) << "\n";
			}

			builder << TestLog::EndMessage;
		}
	}

	if (numErrors > maxMsgs)
	{
		testLog << TestLog::Message << "(Skipped " << (numErrors - maxMsgs) << " messages.)"
			  << TestLog::EndMessage;
	}

	if (numErrors == 0)
	{
		testLog << TestLog::Message << "All " << numValues << " inputs passed."
			  << TestLog::EndMessage;
	}
	else
	{
		testLog << TestLog::Message << numErrors << "/" << numValues << " inputs failed."
			  << TestLog::EndMessage;
	}

	if (numErrors)
		return tcu::TestStatus::fail(de::toString(numErrors) + string(" test failed. Check log for the details"));
	else
		return tcu::TestStatus::pass("Pass");

}